

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.cpp
# Opt level: O1

void __thiscall
cfd::core::KeyData::KeyData
          (KeyData *this,string *path_info,int32_t child_num,bool has_schnorr_pubkey)

{
  ExtPrivkey *this_00;
  ByteData *pBVar1;
  ByteData256 *pBVar2;
  Privkey *this_01;
  ByteData256 *pBVar3;
  Pubkey *this_02;
  pointer pcVar4;
  bool bVar5;
  void *pvVar6;
  pointer puVar7;
  uint __val;
  back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> __result;
  ExtPubkey *pEVar8;
  uint uVar9;
  bool bVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar15;
  CfdException *pCVar16;
  uint uVar17;
  bool bVar18;
  uint __len;
  ulong uVar19;
  _Alloc_hider _Var20;
  size_t __n;
  uint __uval;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> path;
  ByteData bytes;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  list;
  string hdkey_top;
  string key;
  string key_info;
  vector<unsigned_int,_std::allocator<unsigned_int>_> path_list;
  string base_extkey_;
  undefined1 local_1d8 [40];
  ByteData256 local_1b0;
  ByteData local_198;
  bool local_180;
  undefined3 uStack_17f;
  NetType NStack_17c;
  ByteData local_178;
  ByteData256 local_160;
  string local_148;
  Privkey *local_128;
  Privkey *local_120;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_118;
  string local_100;
  string local_e0;
  back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> local_c0;
  string local_b8;
  ByteData local_98;
  ByteData *local_78;
  ExtPubkey *local_70;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_68;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  
  Pubkey::Pubkey(&this->pubkey_);
  local_120 = &this->privkey_;
  Privkey::Privkey(local_120);
  local_128 = (Privkey *)CONCAT44(local_128._4_4_,child_num);
  this_00 = &this->extprivkey_;
  Extkey::Extkey(&this_00->super_Extkey);
  Extkey::Extkey(&(this->extpubkey_).super_Extkey);
  local_c0.container = &this->path_;
  (this->path_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->path_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->path_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78 = &this->fingerprint_;
  local_70 = &this->extpubkey_;
  ByteData::ByteData(local_78);
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  pcVar4 = (path_info->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b8,pcVar4,pcVar4 + path_info->_M_string_length);
  if ((*(path_info->_M_dataplus)._M_p == '[') &&
     (lVar12 = ::std::__cxx11::string::find((char *)path_info,0x707646,0), lVar12 != -1)) {
    ::std::__cxx11::string::substr((ulong)local_1d8,(ulong)path_info);
    ::std::__cxx11::string::operator=((string *)&local_b8,(string *)local_1d8);
    if ((undefined1 *)local_1d8._0_8_ != local_1d8 + 0x10) {
      operator_delete((void *)local_1d8._0_8_,(ulong)(local_1d8._16_8_ + 1));
    }
    ::std::__cxx11::string::substr((ulong)local_1d8,(ulong)path_info);
    lVar12 = ::std::__cxx11::string::find(local_1d8,0x6e1272,0);
    if (lVar12 != -1) {
      if (lVar12 != 0) {
        ::std::__cxx11::string::substr((ulong)&local_100,(ulong)local_1d8);
        ByteData::ByteData((ByteData *)&local_148,&local_100);
        ByteData::operator=(local_78,(ByteData *)&local_148);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148._M_dataplus._M_p !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete(local_148._M_dataplus._M_p,
                          CONCAT71(local_148.field_2._M_allocated_capacity._1_7_,
                                   local_148.field_2._M_local_buf[0]) -
                          (long)local_148._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100._M_dataplus._M_p != &local_100.field_2) {
          operator_delete(local_100._M_dataplus._M_p,
                          CONCAT71(local_100.field_2._M_allocated_capacity._1_7_,
                                   local_100.field_2._M_local_buf[0]) + 1);
        }
      }
      ::std::__cxx11::string::substr((ulong)&local_100,(ulong)local_1d8);
      local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"KeyData","");
      ToArrayFromString((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_e0,&local_100,
                        &local_148,'\0');
      ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign
                (local_c0.container,&local_e0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete(local_e0._M_dataplus._M_p,
                        CONCAT71(local_e0.field_2._M_allocated_capacity._1_7_,
                                 local_e0.field_2._M_local_buf[0]) - (long)local_e0._M_dataplus._M_p
                       );
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._M_dataplus._M_p != &local_148.field_2) {
        operator_delete(local_148._M_dataplus._M_p,
                        CONCAT71(local_148.field_2._M_allocated_capacity._1_7_,
                                 local_148.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p != &local_100.field_2) {
        operator_delete(local_100._M_dataplus._M_p,
                        CONCAT71(local_100.field_2._M_allocated_capacity._1_7_,
                                 local_100.field_2._M_local_buf[0]) + 1);
      }
    }
    if ((undefined1 *)local_1d8._0_8_ != local_1d8 + 0x10) {
      operator_delete((void *)local_1d8._0_8_,(ulong)(local_1d8._16_8_ + 1));
    }
  }
  local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
  local_100._M_string_length = 0;
  local_100.field_2._M_local_buf[0] = '\0';
  if (4 < local_b8._M_string_length) {
    ::std::__cxx11::string::substr((ulong)local_1d8,(ulong)&local_b8);
    ::std::__cxx11::string::operator=((string *)&local_100,(string *)local_1d8);
    if ((undefined1 *)local_1d8._0_8_ != local_1d8 + 0x10) {
      operator_delete((void *)local_1d8._0_8_,(ulong)(local_1d8._16_8_ + 1));
    }
  }
  iVar11 = ::std::__cxx11::string::compare((char *)&local_100);
  if ((iVar11 == 0) || (iVar11 = ::std::__cxx11::string::compare((char *)&local_100), iVar11 == 0))
  {
    local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
    local_148._M_string_length = 0;
    local_148.field_2._M_local_buf[0] = '\0';
    local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
    local_e0._M_string_length = 0;
    local_e0.field_2._M_local_buf[0] = '\0';
    local_1d8._0_8_ = local_1d8 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"/","");
    StringUtil::Split(&local_118,(string *)&local_b8,(string *)local_1d8);
    if ((undefined1 *)local_1d8._0_8_ != local_1d8 + 0x10) {
      operator_delete((void *)local_1d8._0_8_,(ulong)(local_1d8._16_8_ + 1));
    }
    ::std::__cxx11::string::_M_assign((string *)&local_e0);
    if ((ulong)((long)local_118.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_118.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start) < 0x21) {
      bVar10 = false;
    }
    else {
      if ((ulong)((long)local_118.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_118.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start) < 0x21) {
        uVar19 = 2;
        bVar10 = false;
        bVar18 = false;
      }
      else {
        uVar19 = 1;
        lVar12 = 0x20;
        bVar10 = false;
        do {
          if (uVar19 != 1) {
            ::std::__cxx11::string::append((char *)&local_148);
          }
          iVar11 = ::std::__cxx11::string::compare
                             ((char *)((long)&((local_118.
                                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start)->
                                              _M_dataplus)._M_p + lVar12));
          if (iVar11 == 0) {
            bVar18 = false;
            goto LAB_00476575;
          }
          iVar11 = ::std::__cxx11::string::compare
                             ((char *)((long)&((local_118.
                                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start)->
                                              _M_dataplus)._M_p + lVar12));
          if (((iVar11 == 0) ||
              (iVar11 = ::std::__cxx11::string::compare
                                  ((char *)((long)&((local_118.
                                                                                                          
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  _M_dataplus)._M_p + lVar12)), iVar11 == 0)) ||
             (iVar11 = ::std::__cxx11::string::compare
                                 ((char *)((long)&((local_118.
                                                                                                        
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  _M_dataplus)._M_p + lVar12)), iVar11 == 0)) {
            bVar10 = true;
            bVar18 = true;
            goto LAB_00476575;
          }
          ::std::__cxx11::string::_M_append
                    ((char *)&local_148,
                     *(ulong *)((long)&((local_118.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                       _M_p + lVar12));
          lVar13 = ::std::__cxx11::string::find
                             ((char *)((long)&((local_118.
                                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start)->
                                              _M_dataplus)._M_p + lVar12),0x6e2fd8,0);
          bVar18 = true;
          if (((lVar13 == -1) &&
              (lVar13 = ::std::__cxx11::string::find
                                  ((char *)((long)&((local_118.
                                                                                                          
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  _M_dataplus)._M_p + lVar12),0x6e2fdb,0),
              lVar13 == -1)) &&
             ((lVar13 = ::std::__cxx11::string::find
                                  ((char *)((long)&((local_118.
                                                                                                          
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  _M_dataplus)._M_p + lVar12),0x6e48c4,0),
              lVar13 == -1 &&
              (uVar14 = strtoul(*(char **)((long)&((local_118.
                                                                                                        
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  _M_dataplus)._M_p + lVar12),(char **)0x0,0),
              bVar18 = bVar10, 0x7fffffff < uVar14)))) {
            bVar18 = true;
          }
          bVar10 = bVar18;
          uVar19 = uVar19 + 1;
          lVar12 = lVar12 + 0x20;
        } while (uVar19 < (ulong)((long)local_118.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_118.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 5));
        bVar18 = false;
LAB_00476575:
        uVar19 = uVar19 + 1;
      }
      if (uVar19 < (ulong)((long)local_118.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_118.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 5)) {
        local_1d8._0_8_ = "cfdcore_hdwallet.cpp";
        local_1d8._8_4_ = 0x4a8;
        local_1d8._16_8_ = (long)"GetTxInKeyData" + 7;
        logger::log<>((CfdSourceLocation *)local_1d8,kCfdLogLevelWarning,
                      "Failed to extkey path. A \'*\' can only be specified at the end.");
        pCVar16 = (CfdException *)__cxa_allocate_exception(0x30);
        local_1d8._0_8_ = local_1d8 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1d8,
                   "Failed to extkey path. A \'*\' can only be specified at the end.","");
        CfdException::CfdException(pCVar16,kCfdIllegalArgumentError,(string *)local_1d8);
        __cxa_throw(pCVar16,&CfdException::typeinfo,CfdException::~CfdException);
      }
      lVar12 = ::std::__cxx11::string::find
                         ((char *)(local_118.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish + -1),0x5369d7,0);
      __val = (uint)local_128;
      if (lVar12 != -1) {
        if ((int)(uint)local_128 < 0) {
          local_1d8._0_8_ = "cfdcore_hdwallet.cpp";
          local_1d8._8_4_ = 0x4b3;
          local_1d8._16_8_ = (long)"GetTxInKeyData" + 7;
          logger::log<>((CfdSourceLocation *)local_1d8,kCfdLogLevelWarning,
                        "Failed to extkey path. A \'*\' can not support.");
          pCVar16 = (CfdException *)__cxa_allocate_exception(0x30);
          local_1d8._0_8_ = local_1d8 + 0x10;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1d8,"Failed to extkey path. A \'*\' can not support.","");
          CfdException::CfdException(pCVar16,kCfdIllegalArgumentError,(string *)local_1d8);
          __cxa_throw(pCVar16,&CfdException::typeinfo,CfdException::~CfdException);
        }
        __len = 1;
        if (9 < (uint)local_128) {
          uVar9 = 4;
          uVar17 = (uint)local_128;
          do {
            __len = uVar9;
            if (uVar17 < 100) {
              __len = __len - 2;
              goto LAB_0047661a;
            }
            if (uVar17 < 1000) {
              __len = __len - 1;
              goto LAB_0047661a;
            }
            if (uVar17 < 10000) goto LAB_0047661a;
            bVar5 = 99999 < uVar17;
            uVar9 = __len + 4;
            uVar17 = uVar17 / 10000;
          } while (bVar5);
          __len = __len + 1;
        }
LAB_0047661a:
        local_1d8._0_8_ = local_1d8 + 0x10;
        ::std::__cxx11::string::_M_construct((ulong)local_1d8,(char)__len);
        ::std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_1d8._0_8_,__len,__val);
        ::std::__cxx11::string::_M_append((char *)&local_148,local_1d8._0_8_);
        if ((undefined1 *)local_1d8._0_8_ != local_1d8 + 0x10) {
          operator_delete((void *)local_1d8._0_8_,(ulong)(local_1d8._16_8_ + 1));
        }
        if (bVar18) {
          ::std::__cxx11::string::append((char *)&local_148);
        }
      }
    }
    local_50 = &local_40;
    local_48 = 0;
    local_40 = 0;
    iVar11 = ::std::__cxx11::string::compare((char *)&local_100);
    if (iVar11 == 0) {
      ExtPrivkey::ExtPrivkey((ExtPrivkey *)local_1d8,&local_e0);
      (this->extprivkey_).super_Extkey.version_ = local_1d8._0_4_;
      pBVar1 = &(this->extprivkey_).super_Extkey.fingerprint_;
      ByteData::operator=(pBVar1,(ByteData *)(local_1d8 + 8));
      (this->extprivkey_).super_Extkey.depth_ = local_1d8[0x20];
      *(undefined3 *)&(this->extprivkey_).super_Extkey.field_0x21 = local_1d8._33_3_;
      (this->extprivkey_).super_Extkey.child_num_ = local_1d8._36_4_;
      pBVar2 = &(this->extprivkey_).super_Extkey.chaincode_;
      ByteData256::operator=(pBVar2,&local_1b0);
      local_128 = &(this->extprivkey_).super_Extkey.privkey_;
      ByteData::operator=(&local_128->data_,&local_198);
      (this->extprivkey_).super_Extkey.privkey_.is_compressed_ = local_180;
      *(undefined3 *)&(this->extprivkey_).super_Extkey.privkey_.field_0x19 = uStack_17f;
      (this->extprivkey_).super_Extkey.privkey_.net_type_ = NStack_17c;
      this_02 = &(this->extprivkey_).super_Extkey.pubkey_;
      ByteData::operator=(&this_02->data_,&local_178);
      pBVar3 = &(this->extprivkey_).super_Extkey.tweak_sum_;
      ByteData256::operator=(pBVar3,&local_160);
      if (local_160.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_160.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_160.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_160.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_178.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_178.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_178.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_178.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_198.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_198.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_198.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_198.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_1b0.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1b0.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_1b0.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_1b0.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      pvVar6 = (void *)CONCAT44(local_1d8._12_4_,local_1d8._8_4_);
      if (pvVar6 != (void *)0x0) {
        operator_delete(pvVar6,local_1d8._24_8_ - (long)pvVar6);
      }
      if (local_148._M_string_length != 0) {
        ExtPrivkey::DerivePrivkey((ExtPrivkey *)local_1d8,this_00,&local_148);
        (this_00->super_Extkey).version_ = local_1d8._0_4_;
        ByteData::operator=(pBVar1,(ByteData *)(local_1d8 + 8));
        (this->extprivkey_).super_Extkey.depth_ = local_1d8[0x20];
        *(undefined3 *)&(this->extprivkey_).super_Extkey.field_0x21 = local_1d8._33_3_;
        (this->extprivkey_).super_Extkey.child_num_ = local_1d8._36_4_;
        ByteData256::operator=(pBVar2,&local_1b0);
        ByteData::operator=(&local_128->data_,&local_198);
        (this->extprivkey_).super_Extkey.privkey_.is_compressed_ = local_180;
        *(undefined3 *)&(this->extprivkey_).super_Extkey.privkey_.field_0x19 = uStack_17f;
        (this->extprivkey_).super_Extkey.privkey_.net_type_ = NStack_17c;
        ByteData::operator=(&this_02->data_,&local_178);
        ByteData256::operator=(pBVar3,&local_160);
        if (local_160.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_160.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_160.data_.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_160.data_.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (local_178.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_178.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_178.data_.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_178.data_.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (local_198.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_198.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_198.data_.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_198.data_.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (local_1b0.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1b0.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_1b0.data_.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_1b0.data_.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        pvVar6 = (void *)CONCAT44(local_1d8._12_4_,local_1d8._8_4_);
        if (pvVar6 != (void *)0x0) {
          operator_delete(pvVar6,local_1d8._24_8_ - (long)pvVar6);
        }
      }
      ExtPrivkey::GetExtPubkey((ExtPubkey *)local_1d8,this_00);
      (this->extpubkey_).super_Extkey.version_ = local_1d8._0_4_;
      ByteData::operator=(&(this->extpubkey_).super_Extkey.fingerprint_,(ByteData *)(local_1d8 + 8))
      ;
      (this->extpubkey_).super_Extkey.depth_ = local_1d8[0x20];
      *(undefined3 *)&(this->extpubkey_).super_Extkey.field_0x21 = local_1d8._33_3_;
      (this->extpubkey_).super_Extkey.child_num_ = local_1d8._36_4_;
      ByteData256::operator=(&(this->extpubkey_).super_Extkey.chaincode_,&local_1b0);
      ByteData::operator=(&(this->extpubkey_).super_Extkey.privkey_.data_,&local_198);
      (this->extpubkey_).super_Extkey.privkey_.is_compressed_ = local_180;
      *(undefined3 *)&(this->extpubkey_).super_Extkey.privkey_.field_0x19 = uStack_17f;
      (this->extpubkey_).super_Extkey.privkey_.net_type_ = NStack_17c;
      ByteData::operator=(&(this->extpubkey_).super_Extkey.pubkey_.data_,&local_178);
      ByteData256::operator=(&(this->extpubkey_).super_Extkey.tweak_sum_,&local_160);
      if (local_160.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_160.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_160.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_160.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_178.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_178.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_178.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_178.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_198.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_198.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_198.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_198.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_1b0.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1b0.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_1b0.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_1b0.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      pvVar6 = (void *)CONCAT44(local_1d8._12_4_,local_1d8._8_4_);
      if (pvVar6 != (void *)0x0) {
        operator_delete(pvVar6,local_1d8._24_8_ - (long)pvVar6);
      }
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1d8,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_128);
      local_1d8[0x18] = (this->extprivkey_).super_Extkey.privkey_.is_compressed_;
      local_1d8._25_3_ = *(undefined3 *)&(this->extprivkey_).super_Extkey.privkey_.field_0x19;
      local_1d8._28_4_ = (this->extprivkey_).super_Extkey.privkey_.net_type_;
      ByteData::operator=(&local_120->data_,(ByteData *)local_1d8);
      (this->privkey_).is_compressed_ = (bool)local_1d8[0x18];
      *(undefined3 *)&(this->privkey_).field_0x19 = local_1d8._25_3_;
      (this->privkey_).net_type_ = local_1d8._28_4_;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete((void *)local_1d8._0_8_,local_1d8._16_8_ - local_1d8._0_8_);
      }
      Privkey::GetPubkey((Pubkey *)local_1d8,local_120);
      ByteData::operator=((ByteData *)this,(ByteData *)local_1d8);
    }
    else {
      if (bVar10) {
        local_1d8._0_8_ = "cfdcore_hdwallet.cpp";
        local_1d8._8_4_ = 0x4c8;
        local_1d8._16_8_ = (long)"GetTxInKeyData" + 7;
        logger::log<>((CfdSourceLocation *)local_1d8,kCfdLogLevelWarning,
                      "Failed to extPubkey. hardened is extPrivkey only.");
        pCVar16 = (CfdException *)__cxa_allocate_exception(0x30);
        local_1d8._0_8_ = local_1d8 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1d8,"Failed to extPubkey. hardened is extPrivkey only.","");
        CfdException::CfdException(pCVar16,kCfdIllegalArgumentError,(string *)local_1d8);
        __cxa_throw(pCVar16,&CfdException::typeinfo,CfdException::~CfdException);
      }
      ExtPubkey::ExtPubkey((ExtPubkey *)local_1d8,&local_e0);
      (this->extpubkey_).super_Extkey.version_ = local_1d8._0_4_;
      pBVar1 = &(this->extpubkey_).super_Extkey.fingerprint_;
      ByteData::operator=(pBVar1,(ByteData *)(local_1d8 + 8));
      (this->extpubkey_).super_Extkey.depth_ = local_1d8[0x20];
      *(undefined3 *)&(this->extpubkey_).super_Extkey.field_0x21 = local_1d8._33_3_;
      (this->extpubkey_).super_Extkey.child_num_ = local_1d8._36_4_;
      pBVar2 = &(this->extpubkey_).super_Extkey.chaincode_;
      ByteData256::operator=(pBVar2,&local_1b0);
      this_01 = &(this->extpubkey_).super_Extkey.privkey_;
      ByteData::operator=(&this_01->data_,&local_198);
      (this->extpubkey_).super_Extkey.privkey_.is_compressed_ = local_180;
      *(undefined3 *)&(this->extpubkey_).super_Extkey.privkey_.field_0x19 = uStack_17f;
      (this->extpubkey_).super_Extkey.privkey_.net_type_ = NStack_17c;
      local_128 = (Privkey *)&(this->extpubkey_).super_Extkey.pubkey_;
      ByteData::operator=((ByteData *)local_128,&local_178);
      pBVar3 = &(this->extpubkey_).super_Extkey.tweak_sum_;
      ByteData256::operator=(pBVar3,&local_160);
      if (local_160.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_160.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_160.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_160.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_178.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_178.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_178.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_178.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_198.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_198.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_198.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_198.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_1b0.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1b0.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_1b0.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_1b0.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      pvVar6 = (void *)CONCAT44(local_1d8._12_4_,local_1d8._8_4_);
      if (pvVar6 != (void *)0x0) {
        operator_delete(pvVar6,local_1d8._24_8_ - (long)pvVar6);
      }
      pEVar8 = local_70;
      if (local_148._M_string_length != 0) {
        ExtPubkey::DerivePubkey((ExtPubkey *)local_1d8,local_70,&local_148);
        (pEVar8->super_Extkey).version_ = local_1d8._0_4_;
        ByteData::operator=(pBVar1,(ByteData *)(local_1d8 + 8));
        (this->extpubkey_).super_Extkey.depth_ = local_1d8[0x20];
        *(undefined3 *)&(this->extpubkey_).super_Extkey.field_0x21 = local_1d8._33_3_;
        (this->extpubkey_).super_Extkey.child_num_ = local_1d8._36_4_;
        ByteData256::operator=(pBVar2,&local_1b0);
        ByteData::operator=(&this_01->data_,&local_198);
        (this->extpubkey_).super_Extkey.privkey_.is_compressed_ = local_180;
        *(undefined3 *)&(this->extpubkey_).super_Extkey.privkey_.field_0x19 = uStack_17f;
        (this->extpubkey_).super_Extkey.privkey_.net_type_ = NStack_17c;
        ByteData::operator=(&local_128->data_,&local_178);
        ByteData256::operator=(pBVar3,&local_160);
        if (local_160.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_160.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_160.data_.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_160.data_.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (local_178.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_178.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_178.data_.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_178.data_.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (local_198.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_198.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_198.data_.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_198.data_.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (local_1b0.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1b0.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_1b0.data_.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_1b0.data_.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        pvVar6 = (void *)CONCAT44(local_1d8._12_4_,local_1d8._8_4_);
        if (pvVar6 != (void *)0x0) {
          operator_delete(pvVar6,local_1d8._24_8_ - (long)pvVar6);
        }
      }
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1d8,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_128);
      ByteData::operator=((ByteData *)this,(ByteData *)local_1d8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete((void *)local_1d8._0_8_,local_1d8._16_8_ - local_1d8._0_8_);
    }
    if (local_148._M_string_length != 0) {
      local_1d8._0_8_ = local_1d8 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"KeyData","");
      ToArrayFromString(&local_68,&local_148,(string *)local_1d8,'\0');
      if ((undefined1 *)local_1d8._0_8_ != local_1d8 + 0x10) {
        operator_delete((void *)local_1d8._0_8_,(ulong)(local_1d8._16_8_ + 1));
      }
      __result.container = local_c0.container;
      ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
                (local_c0.container,
                 ((long)local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start >> 2) +
                 ((long)(this->path_).
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)(this->path_).
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start >> 2));
      ::std::__copy_move<false,false,std::random_access_iterator_tag>::
      __copy_m<unsigned_int*,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                (local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish,__result);
      if (local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (uint *)0x0) {
        operator_delete(local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_68.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_68.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
    }
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_118);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p,
                      CONCAT71(local_e0.field_2._M_allocated_capacity._1_7_,
                               local_e0.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p == &local_148.field_2) goto LAB_00476e00;
    uVar19 = CONCAT71(local_148.field_2._M_allocated_capacity._1_7_,
                      local_148.field_2._M_local_buf[0]) + 1;
    _Var20._M_p = local_148._M_dataplus._M_p;
  }
  else {
    bVar10 = Privkey::HasWif(&local_b8,(NetType *)0x0,(bool *)0x0);
    if (bVar10) {
      Privkey::FromWif((Privkey *)local_1d8,&local_b8,kCustomChain,true);
      ByteData::operator=(&local_120->data_,(ByteData *)local_1d8);
      (this->privkey_).is_compressed_ = (bool)local_1d8[0x18];
      *(undefined3 *)&(this->privkey_).field_0x19 = local_1d8._25_3_;
      (this->privkey_).net_type_ = local_1d8._28_4_;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete((void *)local_1d8._0_8_,local_1d8._16_8_ - local_1d8._0_8_);
      }
      Privkey::GetPubkey((Pubkey *)local_1d8,local_120);
      ByteData::operator=((ByteData *)this,(ByteData *)local_1d8);
      _Var20._M_p = (pointer)local_1d8._0_8_;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._0_8_ ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) goto LAB_00476e00;
    }
    else {
      ByteData::ByteData((ByteData *)&local_148,&local_b8);
      bVar10 = Pubkey::IsValid((ByteData *)&local_148);
      if (bVar10) {
        local_98.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_98.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_98.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        uVar19 = local_148._M_string_length - (long)local_148._M_dataplus._M_p;
        if (uVar19 == 0) {
          paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0;
        }
        else {
          if ((long)uVar19 < 0) {
            ::std::__throw_bad_alloc();
          }
          paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)operator_new(uVar19);
        }
        local_98.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)(paVar15->_M_local_buf + uVar19);
        __n = local_148._M_string_length - (long)local_148._M_dataplus._M_p;
        local_98.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)paVar15;
        if (__n != 0) {
          local_98.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)paVar15;
          memmove(paVar15,local_148._M_dataplus._M_p,__n);
        }
        local_98.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)(paVar15->_M_local_buf + __n);
        Pubkey::Pubkey((Pubkey *)local_1d8,&local_98);
        ByteData::operator=((ByteData *)this,(ByteData *)local_1d8);
        paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_98.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start;
        puVar7 = local_98.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete((void *)local_1d8._0_8_,local_1d8._16_8_ - local_1d8._0_8_);
          paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_98.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start;
          puVar7 = local_98.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage;
        }
      }
      else if (has_schnorr_pubkey) {
        SchnorrPubkey::SchnorrPubkey((SchnorrPubkey *)local_1d8,(ByteData *)&local_148);
        SchnorrPubkey::CreatePubkey((Pubkey *)&local_e0,(SchnorrPubkey *)local_1d8,false);
        ByteData::operator=((ByteData *)this,(ByteData *)&local_e0);
        paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1d8._0_8_;
        puVar7 = (pointer)local_1d8._16_8_;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete(local_e0._M_dataplus._M_p,
                          CONCAT71(local_e0.field_2._M_allocated_capacity._1_7_,
                                   local_e0.field_2._M_local_buf[0]) -
                          (long)local_e0._M_dataplus._M_p);
          paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1d8._0_8_;
          puVar7 = (pointer)local_1d8._16_8_;
        }
      }
      else {
        Privkey::Privkey((Privkey *)local_1d8,(ByteData *)&local_148,kMainnet,true);
        ByteData::operator=(&local_120->data_,(ByteData *)local_1d8);
        (this->privkey_).is_compressed_ = (bool)local_1d8[0x18];
        *(undefined3 *)&(this->privkey_).field_0x19 = local_1d8._25_3_;
        (this->privkey_).net_type_ = local_1d8._28_4_;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete((void *)local_1d8._0_8_,local_1d8._16_8_ - local_1d8._0_8_);
        }
        Privkey::GetPubkey((Pubkey *)local_1d8,local_120);
        ByteData::operator=((ByteData *)this,(ByteData *)local_1d8);
        paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1d8._0_8_;
        puVar7 = (pointer)local_1d8._16_8_;
      }
      if (paVar15 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete(paVar15,(long)puVar7 - (long)paVar15);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._M_dataplus._M_p ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) goto LAB_00476e00;
      local_1d8._16_8_ =
           CONCAT71(local_148.field_2._M_allocated_capacity._1_7_,local_148.field_2._M_local_buf[0])
      ;
      _Var20._M_p = local_148._M_dataplus._M_p;
    }
    uVar19 = local_1d8._16_8_ - (long)_Var20._M_p;
  }
  operator_delete(_Var20._M_p,uVar19);
LAB_00476e00:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p,
                    CONCAT71(local_100.field_2._M_allocated_capacity._1_7_,
                             local_100.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

KeyData::KeyData(
    const std::string& path_info, int32_t child_num, bool has_schnorr_pubkey) {
  std::string key_info = path_info;
  if (path_info[0] == '[') {
    // key origin information check. cut to ']'
    auto pos = path_info.find("]");
    if (pos != std::string::npos) {
      key_info = path_info.substr(pos + 1);
      auto path = path_info.substr(1, pos - 1);
      pos = path.find("/");
      if (pos != std::string::npos) {
        if (pos != 0) {
          auto fingerprint = path.substr(0, pos);
          fingerprint_ = ByteData(fingerprint);
        }
        auto child_path = path.substr(pos + 1);
        path_ = ToArrayFromString(child_path, "KeyData", 0);
      }
    }
  }
  // derive key check (xpub,etc)D
  std::string hdkey_top;
  if (key_info.size() > 4) hdkey_top = key_info.substr(1, 3);
  if ((hdkey_top == "pub") || (hdkey_top == "prv")) {
    std::string path;
    std::string key;
    bool has_end_any_hardened = false;
    bool exist_hardened = false;
    std::vector<std::string> list = StringUtil::Split(key_info, "/");
    key = list[0];
    if (list.size() > 1) {
      size_t index;
      for (index = 1; index < list.size(); ++index) {
        if (index != 1) path += "/";
        if (list[index] == "*") break;
        if ((list[index] == "*'") || (list[index] == "*h") ||
            (list[index] == "*H")) {
          has_end_any_hardened = true;
          exist_hardened = true;
          break;
        }
        path += list[index];
        if ((list[index].find("'") != std::string::npos) ||
            (list[index].find("h") != std::string::npos) ||
            (list[index].find("H") != std::string::npos)) {
          exist_hardened = true;
        } else {
          auto value = strtoul(list[index].c_str(), nullptr, 0);
          if (value >= 0x80000000) exist_hardened = true;
        }
      }
      if ((index + 1) < list.size()) {
        warn(
            CFD_LOG_SOURCE,
            "Failed to extkey path. "
            "A '*' can only be specified at the end.");
        throw CfdException(
            CfdError::kCfdIllegalArgumentError,
            "Failed to extkey path. "
            "A '*' can only be specified at the end.");
      }
      if (list.back().find("*") != std::string::npos) {
        if (child_num < 0) {
          warn(
              CFD_LOG_SOURCE,
              "Failed to extkey path. "
              "A '*' can not support.");
          throw CfdException(
              CfdError::kCfdIllegalArgumentError,
              "Failed to extkey path. "
              "A '*' can not support.");
        }
        path += std::to_string(child_num);
        if (has_end_any_hardened) path += "h";
      }
    }
    std::string base_extkey_;
    if (hdkey_top == "prv") {
      extprivkey_ = ExtPrivkey(key);
      if (!path.empty()) extprivkey_ = extprivkey_.DerivePrivkey(path);
      extpubkey_ = extprivkey_.GetExtPubkey();
      privkey_ = extprivkey_.GetPrivkey();
      pubkey_ = privkey_.GetPubkey();
    } else if (exist_hardened) {
      warn(
          CFD_LOG_SOURCE, "Failed to extPubkey. hardened is extPrivkey only.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to extPubkey. hardened is extPrivkey only.");
    } else {
      extpubkey_ = ExtPubkey(key);
      if (!path.empty()) extpubkey_ = extpubkey_.DerivePubkey(path);
      pubkey_ = extpubkey_.GetPubkey();
    }
    if (!path.empty()) {
      auto path_list = ToArrayFromString(path, "KeyData", 0);
      path_.reserve(path_.size() + path_list.size());
      std::copy(path_list.begin(), path_list.end(), std::back_inserter(path_));
    }
  } else if (Privkey::HasWif(key_info)) {
    privkey_ = Privkey::FromWif(key_info);
    pubkey_ = privkey_.GetPubkey();
  } else {
    ByteData bytes(key_info);
    if (Pubkey::IsValid(bytes)) {
      pubkey_ = Pubkey(bytes);
    } else if (has_schnorr_pubkey) {
      SchnorrPubkey schnorr_pubkey(bytes);
      pubkey_ = schnorr_pubkey.CreatePubkey();
    } else {
      privkey_ = Privkey(bytes);
      pubkey_ = privkey_.GetPubkey();
    }
  }
}